

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-string-view.cc
# Opt level: O2

void __thiscall
string_view_assignment_operator_Test::TestBody(string_view_assignment_operator_Test *this)

{
  undefined1 auVar1 [16];
  ulong in_RCX;
  string_view sv;
  
  sv.size_ = in_RCX;
  sv.data_ = (char *)0x6;
  anon_unknown.dwarf_aa418::assert_string_view_eq((anon_unknown_dwarf_aa418 *)"assign","assign",sv);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RCX;
  anon_unknown.dwarf_aa418::assert_string_view_eq
            ((anon_unknown_dwarf_aa418 *)0x2899b2,(char *)0x0,(string_view)(auVar1 << 0x40));
  return;
}

Assistant:

TEST(string_view, assignment_operator) {
  string_view sv1;
  sv1 = string_view("assign");
  assert_string_view_eq("assign", sv1);

  string_view sv2;
  sv2 = string_view();
  assert_string_view_eq("", sv2);
}